

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O3

void __thiscall
crampl::detail::Function<std::tuple<int,int>(),false>::
Function<crampl::detail::Function<std::tuple<int,int>(),false>>
          (Function<std::tuple<int,int>(),false> *this,
          Function<std::tuple<int,_int>_(),_false> *lambda)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  
  *(code **)(this + 8) = Function<std::tuple<int,_int>_(),_false>::bad_invoke;
  *(code **)(this + 0x10) = Function<std::tuple<int,_int>_(),_false>::noop_manager;
  uVar1 = *(undefined4 *)((long)&lambda->invoke + 4);
  uVar2 = *(undefined4 *)&lambda->manager;
  uVar3 = *(undefined4 *)((long)&lambda->manager + 4);
  *(undefined4 *)(this + 8) = *(undefined4 *)&lambda->invoke;
  *(undefined4 *)(this + 0xc) = uVar1;
  *(undefined4 *)(this + 0x10) = uVar2;
  *(undefined4 *)(this + 0x14) = uVar3;
  lambda->manager = Function<std::tuple<int,_int>_(),_false>::noop_manager;
  lambda->invoke = Function<std::tuple<int,_int>_(),_false>::bad_invoke;
  (**(code **)(this + 0x10))(lambda,this);
  return;
}

Assistant:

Function(T&& lambda) noexcept {
		init_from(std::forward<T>(lambda));
	}